

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void fiber_reserve_return(Fiber *fbr,FiberFunc f,void **args_dest,size_t args_size)

{
  size_t pgsz;
  char *sp0;
  
  if ((fbr->state & 1) == 0) {
    sp0 = (char *)((long)(fbr->regs).sp - args_size & 0xfffffffffffffff0);
    *args_dest = sp0;
    pgsz = get_page_size();
    if (pgsz - 100 < args_size) {
      probe_stack(sp0,args_size,pgsz);
    }
    *(void **)(sp0 + -8) = (fbr->regs).lr;
    *(void **)(sp0 + -0x10) = (fbr->regs).sp;
    *(FiberFunc *)(sp0 + -0x18) = f;
    *(void **)(sp0 + -0x20) = *args_dest;
    (fbr->regs).lr = fiber_asm_invoke;
    (fbr->regs).sp = sp0 + -0x20;
    return;
  }
  __assert_fail("!fiber_is_executing(fbr)",
                "/workspace/llm4binary/github/license_c_cmakelists/simonfxr[P]fiber/src/fiber.c",
                0x145,"void fiber_reserve_return(Fiber *, FiberFunc, void **, size_t)");
}

Assistant:

void
fiber_reserve_return(Fiber *fbr,
                     FiberFunc f,
                     void **args_dest,
                     size_t args_size)
{
    NULL_CHECK(fbr, "Fiber cannot be NULL");
    assert(!fiber_is_executing(fbr));

    char *sp = hu_cxx_static_cast(char *, fbr->regs.sp);
    size_t arg_align =
      ARG_ALIGNMENT > STACK_ALIGNMENT ? ARG_ALIGNMENT : STACK_ALIGNMENT;
    sp = stack_align_n(sp - args_size, arg_align);
    *args_dest = sp;

    size_t pgsz = get_page_size();
    if (hu_unlikely(args_size > pgsz - 100))
        probe_stack(sp, args_size, pgsz);

    assert(is_stack_aligned(sp));

    push(&sp, fbr->regs.lr);
    push(&sp, fbr->regs.sp);
    push(&sp, hu_cxx_reinterpret_cast(void *, f));
    push(&sp, *args_dest);

    assert(is_stack_aligned(sp));

    fbr->regs.lr = hu_cxx_reinterpret_cast(void *, fiber_asm_invoke);

    fbr->regs.sp = (void *) sp;
}